

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O2

void __thiscall
QAbstractItemView::dataChanged
          (QAbstractItemView *this,QModelIndex *topLeft,QModelIndex *bottomRight,QList<int> *roles)

{
  QAbstractItemViewPrivate *this_00;
  Data *pDVar1;
  bool bVar2;
  char cVar3;
  QEditorInfo *this_01;
  long *plVar4;
  QDebug *pQVar5;
  long lVar6;
  QObject *pQVar7;
  long in_FS_OFFSET;
  QRect QVar8;
  undefined1 auVar9 [16];
  QDebug local_a0;
  undefined1 local_98 [16];
  undefined1 local_88 [8];
  QModelIndex local_80;
  undefined1 local_68 [8];
  Representation RStack_60;
  Representation RStack_5c;
  totally_ordered_wrapper<const_QAbstractItemModel_*> tStack_58;
  char *local_50;
  int local_48;
  int iStack_44;
  int iStack_40;
  int iStack_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QAbstractItemViewPrivate **)(this + 8);
  bVar2 = ::comparesEqual(topLeft,bottomRight);
  if (bVar2) {
    bVar2 = QModelIndex::isValid(topLeft);
    if (bVar2) {
      this_01 = QAbstractItemViewPrivate::editorForIndex(this_00,topLeft);
      if (this_01->isStatic == false) {
        bVar2 = QPointer::operator_cast_to_bool((QPointer *)this_01);
        if (bVar2) {
          plVar4 = (long *)(**(code **)(*(long *)this + 0x208))(this,topLeft);
          if (plVar4 != (long *)0x0) {
            pDVar1 = (this_01->widget).wp.d;
            if ((pDVar1 == (Data *)0x0) || (*(int *)(pDVar1 + 4) == 0)) {
              pQVar7 = (QObject *)0x0;
            }
            else {
              pQVar7 = (this_01->widget).wp.value;
            }
            (**(code **)(*plVar4 + 0x80))(plVar4,pQVar7,topLeft);
          }
        }
      }
      if (((*(byte *)(*(long *)(this + 0x20) + 9) & 0x80) != 0) &&
         (this_00->delayedPendingLayout == false)) {
        update(this,topLeft);
      }
      goto LAB_004e86d9;
    }
  }
  QAbstractItemViewPrivate::updateEditorData(this_00,topLeft,bottomRight);
  if (((*(byte *)(*(long *)(this + 0x20) + 9) & 0x80) == 0) ||
     (this_00->delayedPendingLayout != false)) goto LAB_004e86d9;
  bVar2 = QModelIndex::isValid(topLeft);
  if (bVar2) {
    QModelIndex::parent((QModelIndex *)local_68,topLeft);
    QModelIndex::parent(&local_80,bottomRight);
    bVar2 = ::operator!=((QModelIndex *)local_68,&local_80);
    if (((bVar2) || (bottomRight->r < topLeft->r)) || (bottomRight->c < topLeft->c))
    goto LAB_004e85ca;
    lVar6 = ((long)(bottomRight->c - topLeft->c) + 1) * ((long)(bottomRight->r - topLeft->r) + 1);
    if (lVar6 - this_00->updateThreshold == 0 || lVar6 < this_00->updateThreshold) {
      QVar8 = QWidget::rect((this_00->super_QAbstractScrollAreaPrivate).viewport);
      auVar9 = (**(code **)(*(long *)&(this_00->super_QAbstractScrollAreaPrivate).
                                      super_QFramePrivate.super_QWidgetPrivate + 0x108))
                         (this_00,QVar8._0_8_,QVar8._8_8_,topLeft,bottomRight);
      local_68._0_4_ = auVar9._0_4_;
      local_68._4_4_ = auVar9._4_4_;
      RStack_60.m_i = auVar9._8_4_;
      RStack_5c.m_i = auVar9._12_4_;
      if (((int)local_68._0_4_ <= RStack_60.m_i) && ((int)local_68._4_4_ <= RStack_5c.m_i)) {
        QWidget::update((this_00->super_QAbstractScrollAreaPrivate).viewport,(QRect *)local_68);
      }
      goto LAB_004e86d9;
    }
  }
  else {
LAB_004e85ca:
    local_68._0_4_ = 2;
    tStack_58.ptr._4_4_ = 0;
    local_68._4_4_ = 0;
    RStack_60.m_i = 0;
    RStack_5c.m_i = 0;
    tStack_58.ptr._0_4_ = 0;
    local_50 = "default";
    QMessageLogger::warning();
    local_a0.stream[0x30] = (Stream)0x0;
    pQVar5 = QDebug::operator<<(&local_a0,"dataChanged() called with an invalid index range:");
    pQVar5 = QDebug::operator<<(pQVar5,"\n    topleft: ");
    local_98._0_8_ = pQVar5->stream;
    *(int *)(local_98._0_8_ + 0x28) = *(int *)(local_98._0_8_ + 0x28) + 1;
    ::operator<<((Stream *)&local_80,(QModelIndex *)local_98);
    pQVar5 = QDebug::operator<<((QDebug *)&local_80,"\n    bottomRight:");
    local_98._8_8_ = pQVar5->stream;
    *(int *)(local_98._8_8_ + 0x28) = *(int *)(local_98._8_8_ + 0x28) + 1;
    ::operator<<((Stream *)local_88,(QModelIndex *)(local_98 + 8));
    QDebug::~QDebug((QDebug *)local_88);
    QDebug::~QDebug((QDebug *)(local_98 + 8));
    QDebug::~QDebug((QDebug *)&local_80);
    QDebug::~QDebug((QDebug *)local_98);
    QDebug::~QDebug(&local_a0);
  }
  QWidget::update((this_00->super_QAbstractScrollAreaPrivate).viewport);
LAB_004e86d9:
  cVar3 = QAccessible::isActive();
  if (cVar3 != '\0') {
    RStack_5c.m_i = -0x55555556;
    local_50 = (char *)0x1ffffffff;
    local_68._0_4_ = 0x80b168;
    local_68._4_4_ = 0;
    RStack_60.m_i = 0x116;
    local_48 = topLeft->r;
    iStack_44 = topLeft->c;
    iStack_40 = bottomRight->r;
    iStack_3c = bottomRight->c;
    tStack_58.ptr = (QAbstractItemModel *)this;
    QAccessible::updateAccessibility((QAccessibleEvent *)local_68);
    QAccessibleTableModelChangeEvent::~QAccessibleTableModelChangeEvent
              ((QAccessibleTableModelChangeEvent *)local_68);
  }
  QAbstractItemViewPrivate::updateGeometry(this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAbstractItemView::dataChanged(const QModelIndex &topLeft, const QModelIndex &bottomRight,
                                    const QList<int> &roles)
{
    Q_UNUSED(roles);
    // Single item changed
    Q_D(QAbstractItemView);
    if (topLeft == bottomRight && topLeft.isValid()) {
        const QEditorInfo &editorInfo = d->editorForIndex(topLeft);
        //we don't update the edit data if it is static
        if (!editorInfo.isStatic && editorInfo.widget) {
            QAbstractItemDelegate *delegate = itemDelegateForIndex(topLeft);
            if (delegate) {
                delegate->setEditorData(editorInfo.widget.data(), topLeft);
            }
        }
        if (isVisible() && !d->delayedPendingLayout) {
            // otherwise the items will be updated later anyway
            update(topLeft);
        }
    } else {
        d->updateEditorData(topLeft, bottomRight);
        if (isVisible() && !d->delayedPendingLayout) {
            if (!topLeft.isValid() ||
                topLeft.parent() != bottomRight.parent() ||
                topLeft.row() > bottomRight.row() ||
                topLeft.column() > bottomRight.column()) {
                // invalid parameter - call update() to redraw all
                qWarning().nospace() << "dataChanged() called with an invalid index range:"
                                     << "\n    topleft: " << topLeft
                                     << "\n    bottomRight:" << bottomRight;
                d->viewport->update();
            } else if ((bottomRight.row() - topLeft.row() + 1LL) *
                       (bottomRight.column() - topLeft.column() + 1LL) > d->updateThreshold) {
                // too many indices to check - force full update
                d->viewport->update();
            } else {
                const QRect updateRect = d->intersectedRect(d->viewport->rect(), topLeft, bottomRight);
                if (!updateRect.isEmpty())
                    d->viewport->update(updateRect);
            }
        }
    }

#if QT_CONFIG(accessibility)
    if (QAccessible::isActive()) {
        QAccessibleTableModelChangeEvent accessibleEvent(this, QAccessibleTableModelChangeEvent::DataChanged);
        accessibleEvent.setFirstRow(topLeft.row());
        accessibleEvent.setFirstColumn(topLeft.column());
        accessibleEvent.setLastRow(bottomRight.row());
        accessibleEvent.setLastColumn(bottomRight.column());
        QAccessible::updateAccessibility(&accessibleEvent);
    }
#endif
    d->updateGeometry();
}